

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entries.cpp
# Opt level: O0

Data * DL::Expressions::anonymous_func(Data *__return_storage_ptr__,vector_t<Data> *args,VM *vm)

{
  bool bVar1;
  DataType DVar2;
  DataGroup *this;
  vector_t<Data> *this_00;
  allocator local_111;
  string local_110 [39];
  undefined1 local_e9;
  reference local_e8;
  Data *data;
  const_iterator __end3;
  const_iterator __begin3;
  vector_t<Data> *__range3;
  string local_c0 [32];
  undefined1 local_a0 [8];
  DataGroup grp;
  undefined1 local_80 [8];
  Data d;
  VM *vm_local;
  vector_t<Data> *args_local;
  Data *r;
  
  d._88_8_ = vm;
  union_func((Data *)local_80,args,vm);
  DVar2 = Data::type((Data *)local_80);
  if (DVar2 == DT_Group) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c0,"",(allocator *)((long)&__range3 + 7));
    DataGroup::DataGroup((DataGroup *)local_a0,(string_t *)local_c0);
    std::__cxx11::string::~string(local_c0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range3 + 7));
    this = Data::getGroup((Data *)local_80);
    this_00 = DataGroup::getAnonymousEntries(this);
    __end3 = std::vector<DL::Data,_std::allocator<DL::Data>_>::begin(this_00);
    data = (Data *)std::vector<DL::Data,_std::allocator<DL::Data>_>::end(this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_DL::Data_*,_std::vector<DL::Data,_std::allocator<DL::Data>_>_>
                                       *)&data), bVar1) {
      local_e8 = __gnu_cxx::
                 __normal_iterator<const_DL::Data_*,_std::vector<DL::Data,_std::allocator<DL::Data>_>_>
                 ::operator*(&__end3);
      DataGroup::add((DataGroup *)local_a0,local_e8);
      __gnu_cxx::
      __normal_iterator<const_DL::Data_*,_std::vector<DL::Data,_std::allocator<DL::Data>_>_>::
      operator++(&__end3);
    }
    local_e9 = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_110,"",&local_111);
    Data::Data(__return_storage_ptr__,(string_t *)local_110);
    std::__cxx11::string::~string(local_110);
    std::allocator<char>::~allocator((allocator<char> *)&local_111);
    Data::setGroup(__return_storage_ptr__,(DataGroup *)local_a0);
    local_e9 = 1;
    DataGroup::~DataGroup((DataGroup *)local_a0);
  }
  else {
    Data::Data(__return_storage_ptr__,(Data *)local_80);
  }
  Data::~Data((Data *)local_80);
  return __return_storage_ptr__;
}

Assistant:

Data anonymous_func(const vector_t<Data>& args, VM& vm)
{
	Data d = union_func(args, vm);

	if (d.type() == DT_Group) {
		DataGroup grp;
		for (const Data& data : d.getGroup().getAnonymousEntries())
			grp.add(data);

		Data r;
		r.setGroup(grp);
		return r;
	}

	return d;
}